

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

void __thiscall
USBAnalyzerResults::GenerateExportFileControlTransfers
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  _Base_ptr p_Var1;
  undefined2 uVar2;
  byte bVar3;
  ostream *poVar4;
  reference pvVar5;
  undefined1 local_4a8 [64];
  undefined1 local_468 [32];
  undefined1 local_448 [32];
  undefined1 local_428 [32];
  undefined1 local_408 [64];
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [64];
  string local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [40];
  U64 local_2c0;
  _Base_ptr p_Stack_2b8;
  _Base_ptr local_2b0;
  undefined2 local_2a0;
  pointer local_298;
  U64 fcnt;
  undefined1 local_288 [7];
  U8 address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  U64 num_frames;
  Frame f;
  char local_248;
  char cStack_247;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  DisplayBase display_base_local;
  char *file_local;
  USBAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  Frame::Frame((Frame *)&num_frames);
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)AnalyzerResults::GetNumFrames();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_288);
  fcnt._7_1_ = 0;
  local_298 = (pointer)0x0;
  do {
    if (results.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage <= local_298) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel
                ((ulonglong)this,
                 (ulonglong)
                 results.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2e8._36_4_ = 0;
LAB_00152ea4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
      Frame::~Frame((Frame *)&num_frames);
      std::ofstream::~ofstream(&trigger_sample);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&local_2c0);
    uVar2 = local_2a0;
    p_Var1 = local_2b0;
    num_frames = local_2c0;
    _f = p_Stack_2b8;
    Frame::~Frame((Frame *)&local_2c0);
    bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                      ((ulonglong)this,(ulonglong)local_298);
    if ((bVar3 & 1) != 0) {
      local_2e8._36_4_ = 1;
      goto LAB_00152ea4;
    }
    local_248 = (char)uVar2;
    if (local_248 == '\x04') {
      fcnt._7_1_ = (byte)p_Var1;
    }
    cStack_247 = (char)((ushort)uVar2 >> 8);
    if (cStack_247 == '\b') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,"STATUS time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_2e8,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_2e8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_2e8);
    }
    else if (cStack_247 == '\x03') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,"DATA time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_308,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_308);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_308);
    }
    else if (cStack_247 == '\x04') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,"Descriptor time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_328,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_328);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_328);
    }
    else if (cStack_247 == '\x02') {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&trigger_sample,std::endl<char,std::char_traits<char>>);
      int2str_sal_abi_cxx11_((U64)(local_3a8 + 0x20),(uint)fcnt._7_1_,display_base);
      std::operator+((char *)local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "SETUP address: ");
      std::operator+(local_348,(char *)local_368);
      poVar4 = std::operator<<(poVar4,(string *)local_348);
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_3a8,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_3a8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_3a8);
      std::__cxx11::string::~string((string *)local_348);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
    }
    if (((local_248 == '\r') || (local_248 == '\x0e')) && (cStack_247 != '\x01')) {
      GetFrameDesc((Frame *)&num_frames,display_base,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_288,&this->mAllStringDescriptors);
      poVar4 = std::operator<<((ostream *)&trigger_sample,"\t");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288);
      poVar4 = std::operator<<(poVar4,(string *)pvVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (local_248 == '\x06') {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&trigger_sample,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"USB RESET Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_3c8,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_3c8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_3c8);
    }
    if (cStack_247 == '\v') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,"\t");
      GetPIDName_abi_cxx11_((int)local_408 + 0x20);
      poVar4 = std::operator<<(poVar4,(string *)(local_408 + 0x20));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(local_408 + 0x20));
    }
    else if (cStack_247 == '\x05') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,
                               "\t<data IN packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_408,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_408);
      poVar4 = std::operator<<(poVar4,'>');
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_408);
    }
    else if (cStack_247 == '\x06') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,
                               "\t<data OUT packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_428,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_428);
      poVar4 = std::operator<<(poVar4,'>');
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_428);
    }
    else if (cStack_247 == '\n') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,
                               "\t<status IN packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_448,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_448);
      poVar4 = std::operator<<(poVar4,'>');
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_448);
    }
    else if (cStack_247 == '\t') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,
                               "\t<status OUT data packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_468,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_468);
      poVar4 = std::operator<<(poVar4,'>');
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_468);
    }
    else if (cStack_247 == '\f') {
      poVar4 = std::operator<<((ostream *)&trigger_sample,"Unexpected packet ");
      GetPIDName_abi_cxx11_((int)local_4a8 + 0x20);
      poVar4 = std::operator<<(poVar4,(string *)(local_4a8 + 0x20));
      poVar4 = std::operator<<(poVar4,". Time: ");
      GetSampleTimeStr_abi_cxx11_((USBAnalyzerResults *)local_4a8,(S64)this);
      poVar4 = std::operator<<(poVar4,(string *)local_4a8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_4a8);
      std::__cxx11::string::~string((string *)(local_4a8 + 0x20));
    }
    local_298 = local_298 + 1;
  } while( true );
}

Assistant:

void USBAnalyzerResults::GenerateExportFileControlTransfers( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> results;
    U8 address = 0;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        if( f.mType == FT_AddrEndp )
            address = U8( f.mData1 );

        if( f.mFlags == FF_StatusBegin )
            file_stream << "STATUS time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataBegin )
            file_stream << "DATA time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataDescriptor )
            file_stream << "Descriptor time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_SetupBegin )
            file_stream << std::endl
                        << "SETUP address: " + int2str_sal( address, display_base, 7 ) + " time: "
                        << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;

        if( ( f.mType == FT_ControlTransferField || f.mType == FT_HIDReportDescriptorItem ) && f.mFlags != FF_FieldIncomplete )
        {
            GetFrameDesc( f, display_base, results, mAllStringDescriptors );

            // output the packet
            file_stream << "\t" << results.front() << std::endl;
        }
        else if( f.mType == FT_Reset )
        {
            file_stream << std::endl << "USB RESET Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        }

        if( f.mFlags == FF_StatusEnd )
            file_stream << "\t" << GetPIDName( USB_PID( f.mData1 ) ) << std::endl;
        else if( f.mFlags == FF_DataInNAKed )
            file_stream << "\t<data IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_DataOutNAKed )
            file_stream << "\t<data OUT packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusInNAKed )
            file_stream << "\t<status IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusOutNAKed )
            file_stream << "\t<status OUT data packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_UnexpectedPacket )
            file_stream << "Unexpected packet " << GetPIDName( USB_PID( f.mData1 ) )
                        << ". Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}